

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O2

deFileResult deFile_write(deFile *file,void *buf,deInt64 bufSize,deInt64 *numWrittenPtr)

{
  deFileResult dVar1;
  ssize_t numBytes;
  
  numBytes = write(file->fd,buf,bufSize);
  if (numWrittenPtr != (deInt64 *)0x0) {
    *numWrittenPtr = numBytes;
  }
  dVar1 = mapReadWriteResult(numBytes);
  return dVar1;
}

Assistant:

deFileResult deFile_write (deFile* file, const void* buf, deInt64 bufSize, deInt64* numWrittenPtr)
{
	deInt64 numWritten = write(file->fd, buf, (size_t)bufSize);

	if (numWrittenPtr)
		*numWrittenPtr = numWritten;

	return mapReadWriteResult(numWritten);
}